

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_streambuf.hpp
# Opt level: O2

void __thiscall
asio::basic_streambuf_ref<std::allocator<char>_>::commit
          (basic_streambuf_ref<std::allocator<char>_> *this,size_t n)

{
  basic_streambuf<std::allocator<char>_> *pbVar1;
  ulong uVar2;
  long lVar3;
  
  pbVar1 = this->sb_;
  uVar2 = *(long *)&pbVar1->field_0x30 - *(long *)&pbVar1->field_0x28;
  if (n <= uVar2) {
    uVar2 = n;
  }
  lVar3 = (long)(int)uVar2 + *(long *)&pbVar1->field_0x28;
  *(long *)&pbVar1->field_0x28 = lVar3;
  *(long *)&pbVar1->field_0x18 = lVar3;
  return;
}

Assistant:

void commit(std::size_t n)
  {
    return sb_.commit(n);
  }